

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPerpTangentPoints.cpp
# Opt level: O2

int TestPerpTangentPoints(string *sFilePath)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  failure e;
  undefined1 local_268 [16];
  string local_258;
  ifstream infile;
  byte abStack_218 [488];
  byte bVar4;
  
  std::ifstream::ifstream(&infile);
  std::ios::exceptions((int)&infile + (int)*(undefined8 *)(_infile + -0x18));
  _e = local_268;
  local_268[0] = 0;
  std::ifstream::open((char *)&infile,(_Ios_Openmode)(sFilePath->_M_dataplus)._M_p);
  bVar3 = 1;
  bVar4 = 1;
  while ((abStack_218[*(long *)(_infile + -0x18)] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&infile,(string *)&e);
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&e);
    if (*pcVar2 != '#') {
      std::__cxx11::string::string((string *)&local_258,(string *)&e);
      bVar1 = ParseTestPerpTangentPoints(&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      bVar3 = bVar4;
      if (!bVar1) {
        bVar3 = 0;
        bVar4 = bVar3;
      }
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&e);
  std::ifstream::~ifstream(&infile);
  return (uint)bVar3;
}

Assistant:

int TestPerpTangentPoints(const string &sFilePath)
{
    ifstream infile;
    infile.exceptions(ifstream::eofbit | ifstream::failbit | ifstream::badbit);
    int nCount = 0;
    int nCommentCount = 0;
    bool bPassed = true;
    try
    {
        string sLine;
        infile.open(sFilePath.c_str(), ifstream::in);

        while (!infile.eof())
        {
            getline(infile, sLine);
            if (sLine.at(0) == '#')
            {
                nCommentCount++;
            }
            else
            {
                if (!ParseTestPerpTangentPoints(sLine))
                    bPassed = false;
                nCount++;
            }
        }
        infile.close();
        return bPassed;
    }

    catch (ifstream::failure e)
    {
        int nError = -99;
        // Per C++ standards for ifstream::failbit with global function getline
        // No characters were extracted because the end was prematurely found.Notice
        // that some eofbit cases will also set failbit.
        // In this case the end of the file is read and causes both flags to be raised,
        // so this presumably means all the data has been read correctly.
        if ((infile.rdstate() & ifstream::failbit) && (infile.rdstate() & ifstream::eofbit) != 0)
            nError = bPassed;
        else if ((infile.rdstate() & ifstream::failbit) != 0)
            nError = -1;
        else if ((infile.rdstate() & ifstream::badbit) != 0)
            nError = -2;
        else if ((infile.rdstate() & ifstream::eofbit) != 0)
            nError = -3;
        if (infile.is_open())
            infile.close();
        return nError;
    }
}